

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000016b620 = 0x2e2e2e2e2e2e2e;
    uRam000000000016b627 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0016b610 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016b618 = 0x2e2e2e2e2e2e2e;
    DAT_0016b61f = 0x2e;
    _DAT_0016b600 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016b608 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0016b5f0 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016b5f8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016b5e8 = 0x2e2e2e2e2e2e2e2e;
    DAT_0016b62f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }